

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall
BoardView::SearchColumnGenerate
          (BoardView *this,string *title,
          pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
          *results,char *search,int limit)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  size_type sVar2;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<char> *in_stack_fffffffffffffe80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  offset_in_BoardView_to_subr in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffec8;
  BoardView *in_stack_fffffffffffffed0;
  undefined1 local_109 [25];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  code *local_d0;
  undefined8 local_c8;
  ImVec2 *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [8];
  string *in_stack_ffffffffffffffc0;
  SpellCorrector *in_stack_ffffffffffffffc8;
  ImVec2 local_2c [5];
  
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)std::__cxx11::string::c_str();
  ImVec2::ImVec2(local_2c,0.0,0.0);
  bVar1 = ImGui::BeginListBox(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if (bVar1) {
    if ((in_RDI[0x6b5]._M_string_length & 0x10000) != 0) {
      bVar1 = std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::empty((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                       *)in_stack_fffffffffffffe60);
      if ((bVar1) &&
         (((in_RDI[0x6b5]._M_string_length & 0x1000000) == 0 ||
          (bVar1 = std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::empty
                             ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>
                               *)in_stack_fffffffffffffe60), bVar1)))) {
        in_stack_fffffffffffffe80 = &local_69;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(in_RDI,in_RDX,in_stack_fffffffffffffe80);
        SpellCorrector::suggest(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator(&local_69);
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_68 + 0x20));
        if (sVar2 != 0) {
          ImGui::Text("Did you mean...");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(in_stack_fffffffffffffea0,__x);
          ShowSearchResults<std::__cxx11::string>
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffea8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(in_stack_fffffffffffffe60);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_fffffffffffffe60);
      }
      else {
        std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
        vector((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               in_stack_fffffffffffffea0,
               (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               __x);
        local_d0 = FindComponent;
        local_c8 = 0;
        ShowSearchResults<std::shared_ptr<Component>>
                  (in_stack_fffffffffffffed0,
                   (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                    *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffea8);
        std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
        ~vector((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
                in_stack_fffffffffffffe60);
      }
    }
    if ((in_RDI[0x6b5]._M_string_length & 0x1000000) != 0) {
      bVar1 = std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::empty
                        ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                         in_stack_fffffffffffffe60);
      if ((bVar1) &&
         (((in_RDI[0x6b5]._M_string_length & 0x10000) == 0 ||
          (bVar1 = std::
                   vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                   ::empty((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                            *)in_stack_fffffffffffffe60), bVar1)))) {
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_109;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(in_RDI,in_RDX,in_stack_fffffffffffffe80);
        SpellCorrector::suggest(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        std::__cxx11::string::~string((string *)(local_109 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_109);
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_e8);
        if (sVar2 != 0) {
          ImGui::Text("Did you mean...");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(in_stack_fffffffffffffea0,__x);
          ShowSearchResults<std::__cxx11::string>
                    ((BoardView *)0x0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)FindNet,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     in_stack_fffffffffffffea8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_00);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(this_00);
      }
      else {
        std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::vector
                  ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                   in_stack_fffffffffffffea0,
                   (vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)__x);
        ShowSearchResults<std::shared_ptr<Net>>
                  (in_stack_fffffffffffffed0,
                   (vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                   in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0);
        std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
                  ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                   in_stack_fffffffffffffe60);
      }
    }
    ImGui::EndListBox();
  }
  return;
}

Assistant:

void BoardView::SearchColumnGenerate(const std::string &title,
                                     std::pair<SharedVector<Component>, SharedVector<Net>> results,
                                     char *search,
                                     int limit) {
	if (ImGui::BeginListBox(title.c_str())) {

		if (m_searchComponents) {
			if (results.first.empty() && (!m_searchNets || results.second.empty())) { // show suggestions only if there is no result at all
				auto s = scparts.suggest(search);
				if (s.size() > 0) {
					ImGui::Text("Did you mean...");
					ShowSearchResults(s, search, limit, &BoardView::FindComponent);
				}
			} else
				ShowSearchResults(results.first, search, limit, &BoardView::FindComponent);
		}

		if (m_searchNets) {
			if (results.second.empty() && (!m_searchComponents || results.first.empty())) {
				auto s = scnets.suggest(search);
				if (s.size() > 0) {
					ImGui::Text("Did you mean...");
					ShowSearchResults(s, search, limit, &BoardView::FindNet);
				}
			} else
				ShowSearchResults(results.second, search, limit, &BoardView::FindNet);
		}

		ImGui::EndListBox();
	}
}